

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<std::_List_iterator<State>_>::relocate
          (QArrayDataPointer<std::_List_iterator<State>_> *this,qsizetype offset,
          _List_iterator<State> **data)

{
  _List_iterator<State> *d_first;
  _List_iterator<State> *p_Var1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<std::_List_iterator<State>,long_long>
            (this->ptr,this->size,d_first);
  if (data != (_List_iterator<State> **)0x0) {
    p_Var1 = *data;
    if ((this->ptr <= p_Var1) && (p_Var1 < this->ptr + this->size)) {
      *data = p_Var1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }